

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

bool vkt::sr::anon_unknown_0::reverifyConstantDerivateWithFlushRelaxations
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Precision precision,Vec4 *derivScale,Vec4 *derivBias,
               Vec4 *surfaceThreshold,DerivateFunc derivateFunc,Linear2DFunctionEvaluator *function)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int y_00;
  float *pfVar4;
  MessageBuilder *pMVar5;
  float fVar6;
  double dVar7;
  double local_858;
  char (*local_830) [2];
  MessageBuilder local_748;
  MessageBuilder local_5c8;
  double local_448;
  double local_440;
  double local_438;
  byte local_42d;
  undefined1 local_42c [412];
  Interval local_290;
  Interval local_278;
  undefined1 local_260 [8];
  Interval finalResultRange;
  Interval local_230;
  undefined1 local_218 [8];
  Interval divisionResultRange;
  undefined1 local_1e8 [8];
  Interval divisionRange;
  Interval local_1b8;
  undefined1 local_1a0 [8];
  Interval numeratorRange;
  int numeratorHiBits;
  int numeratorLoBits;
  int numeratorHiBitsLost;
  int numeratorLoBitsLost;
  Float<unsigned_int,_8,_23,_127,_3U> local_170;
  int numeratorHiExp;
  undefined1 local_168 [4];
  int numeratorLoExp;
  Interval numerator;
  Float<unsigned_int,_8,_23,_127,_3U> local_148;
  Float<unsigned_int,_8,_23,_127,_3U> local_144;
  Float<unsigned_int,_8,_23,_127,_3U> local_140;
  int local_13c;
  undefined1 local_138 [4];
  int maxValueExp;
  Interval local_120;
  undefined1 local_108 [8];
  Interval backwardComponent;
  Interval local_d8;
  undefined1 local_c0 [8];
  Interval forwardComponent;
  int c;
  bool anyComponentFailed;
  Vec4 functionValueBackward;
  Vec4 functionValueForward;
  Vec4 resultDerivative;
  int x;
  int y;
  int numFailedPixels;
  int numVaryingSampleBits;
  int minExponent;
  int numBits;
  int numComponents;
  float divisionErrorUlps;
  IVec4 green;
  IVec4 red;
  Vec4 *derivScale_local;
  Precision precision_local;
  DataType dataType_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  TestLog *log_local;
  
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(green.m_data + 2),0xff,0,0,0xff);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&numComponents,0,0xff,0,0xff);
  numBits = 0x40200000;
  minExponent = glu::getDataTypeFloatScalars(dataType);
  numVaryingSampleBits = getNumMantissaBits(precision);
  numFailedPixels = getMinExponent(precision);
  y = numVaryingSampleBits + -3;
  x = 0;
  tcu::clear(errorMask,(IVec4 *)&numComponents);
  resultDerivative.m_data[3] = 0.0;
  do {
    fVar6 = resultDerivative.m_data[3];
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(result);
    if (iVar2 <= (int)fVar6) {
      if (9 < x) {
        tcu::TestLog::operator<<(&local_5c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_5c8,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5c8);
      }
      if (0 < x) {
        tcu::TestLog::operator<<(&local_748,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_748,(char (*) [13])"FAIL: found ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&x);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])" failed pixels");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_748);
      }
      return x == 0;
    }
    for (resultDerivative.m_data[2] = 0.0; fVar6 = resultDerivative.m_data[2],
        iVar2 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar6 < iVar2;
        resultDerivative.m_data[2] = (float)((int)resultDerivative.m_data[2] + 1)) {
      readDerivate((anon_unknown_0 *)(functionValueForward.m_data + 2),result,derivScale,derivBias,
                   (int)resultDerivative.m_data[2],(int)resultDerivative.m_data[3]);
      bVar1 = isDfdxFunc(derivateFunc);
      if (bVar1) {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)(functionValueBackward.m_data + 2),
                   (float)(int)resultDerivative.m_data[2] + 2.0,
                   (float)(int)resultDerivative.m_data[3] + 0.5);
      }
      else {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)(functionValueBackward.m_data + 2),
                   (float)(int)resultDerivative.m_data[2] + 0.5,
                   (float)(int)resultDerivative.m_data[3] + 2.0);
      }
      bVar1 = isDfdyFunc(derivateFunc);
      if (bVar1) {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)&c,(float)(int)resultDerivative.m_data[2] - 1.0,
                   (float)(int)resultDerivative.m_data[3] + 0.5);
      }
      else {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)&c,(float)(int)resultDerivative.m_data[2] + 0.5,
                   (float)(int)resultDerivative.m_data[3] - 1.0);
      }
      forwardComponent.m_hi._7_1_ = 0;
      for (forwardComponent.m_hi._0_4_ = 0; forwardComponent.m_hi._0_4_ < minExponent;
          forwardComponent.m_hi._0_4_ = forwardComponent.m_hi._0_4_ + 1) {
        pfVar4 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(functionValueBackward.m_data + 2),
                            forwardComponent.m_hi._0_4_);
        fVar6 = addErrorUlp(*pfVar4,-0.5,y);
        fVar6 = convertFloatFlushToZeroRtn(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval(&local_d8,(double)fVar6);
        pfVar4 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(functionValueBackward.m_data + 2),
                            forwardComponent.m_hi._0_4_);
        fVar6 = addErrorUlp(*pfVar4,0.5,y);
        fVar6 = convertFloatFlushToZeroRtp(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval((Interval *)&backwardComponent.m_hi,(double)fVar6);
        tcu::Interval::Interval((Interval *)local_c0,&local_d8,(Interval *)&backwardComponent.m_hi);
        pfVar4 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)&c,forwardComponent.m_hi._0_4_);
        fVar6 = addErrorUlp(*pfVar4,-0.5,y);
        fVar6 = convertFloatFlushToZeroRtn(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval(&local_120,(double)fVar6);
        pfVar4 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)&c,forwardComponent.m_hi._0_4_);
        fVar6 = addErrorUlp(*pfVar4,0.5,y);
        fVar6 = convertFloatFlushToZeroRtp(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval((Interval *)local_138,(double)fVar6);
        tcu::Interval::Interval((Interval *)local_108,&local_120,(Interval *)local_138);
        dVar7 = tcu::Interval::lo((Interval *)local_c0);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_140,dVar7);
        iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_140);
        dVar7 = tcu::Interval::hi((Interval *)local_c0);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_144,dVar7);
        iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_144);
        iVar2 = de::max<int>(iVar2,iVar3);
        dVar7 = tcu::Interval::lo((Interval *)local_108);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_148,dVar7);
        iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_148);
        dVar7 = tcu::Interval::hi((Interval *)local_108);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&numerator.m_hi + 4),dVar7);
        y_00 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                         ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&numerator.m_hi + 4));
        iVar3 = de::max<int>(iVar3,y_00);
        local_13c = de::max<int>(iVar2,iVar3);
        tcu::operator-((Interval *)local_168,(Interval *)local_c0,(Interval *)local_108);
        dVar7 = tcu::Interval::lo((Interval *)local_168);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_170,dVar7);
        numeratorHiExp = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_170);
        dVar7 = tcu::Interval::hi((Interval *)local_168);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)&numeratorHiBitsLost,dVar7);
        numeratorLoBitsLost =
             tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                       ((Float<unsigned_int,_8,_23,_127,_3U> *)&numeratorHiBitsLost);
        iVar2 = de::max<int>(0,local_13c - numeratorHiExp);
        iVar3 = de::max<int>(0,local_13c - numeratorLoBitsLost);
        numeratorRange.m_hi._4_4_ = de::max<int>(0,numVaryingSampleBits - iVar2);
        numeratorRange.m_hi._0_4_ = de::max<int>(0,numVaryingSampleBits - iVar3);
        dVar7 = tcu::Interval::lo((Interval *)local_168);
        fVar6 = convertFloatFlushToZeroRtn((float)dVar7,numFailedPixels,numeratorRange.m_hi._4_4_);
        tcu::Interval::Interval(&local_1b8,(double)fVar6);
        dVar7 = tcu::Interval::hi((Interval *)local_168);
        fVar6 = convertFloatFlushToZeroRtp((float)dVar7,numFailedPixels,numeratorRange.m_hi._0_4_);
        tcu::Interval::Interval((Interval *)&divisionRange.m_hi,(double)fVar6);
        tcu::Interval::Interval((Interval *)local_1a0,&local_1b8,(Interval *)&divisionRange.m_hi);
        tcu::Interval::Interval((Interval *)&divisionResultRange.m_hi,3.0);
        tcu::operator/((Interval *)local_1e8,(Interval *)local_1a0,
                       (Interval *)&divisionResultRange.m_hi);
        dVar7 = tcu::Interval::lo((Interval *)local_1e8);
        fVar6 = addErrorUlp((float)dVar7,-2.5,numVaryingSampleBits);
        fVar6 = convertFloatFlushToZeroRtn(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval(&local_230,(double)fVar6);
        dVar7 = tcu::Interval::hi((Interval *)local_1e8);
        fVar6 = addErrorUlp((float)dVar7,2.5,numVaryingSampleBits);
        fVar6 = convertFloatFlushToZeroRtp(fVar6,numFailedPixels,numVaryingSampleBits);
        tcu::Interval::Interval((Interval *)&finalResultRange.m_hi,(double)fVar6);
        tcu::Interval::Interval((Interval *)local_218,&local_230,(Interval *)&finalResultRange.m_hi)
        ;
        dVar7 = tcu::Interval::lo((Interval *)local_218);
        pfVar4 = tcu::Vector<float,_4>::operator[](surfaceThreshold,forwardComponent.m_hi._0_4_);
        tcu::Interval::Interval(&local_278,dVar7 - (double)*pfVar4);
        dVar7 = tcu::Interval::hi((Interval *)local_218);
        pfVar4 = tcu::Vector<float,_4>::operator[](surfaceThreshold,forwardComponent.m_hi._0_4_);
        tcu::Interval::Interval(&local_290,dVar7 + (double)*pfVar4);
        tcu::Interval::Interval((Interval *)local_260,&local_278,&local_290);
        pfVar4 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                            forwardComponent.m_hi._0_4_);
        fVar6 = *pfVar4;
        dVar7 = tcu::Interval::lo((Interval *)local_260);
        if ((double)fVar6 < dVar7) {
LAB_00a9dab0:
          if (x < 10) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)(local_42c + 0x1c),log,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)(local_42c + 0x1c),
                                (char (*) [19])"Error in pixel at ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(resultDerivative.m_data + 2));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x136aa81);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(resultDerivative.m_data + 3));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])" with component ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&forwardComponent.m_hi);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])" (channel ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,"rgba" + forwardComponent.m_hi._0_4_);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x13186d3);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])"\tGot pixel value ");
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_42c,(int)result,
                       (int)resultDerivative.m_data[2],(int)resultDerivative.m_data[3]);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Vector<int,_4> *)local_42c);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])"\t\tdFd");
            bVar1 = isDfdxFunc(derivateFunc);
            local_42d = bVar1 ^ 0x79;
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char *)&local_42d);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])" ~= ");
            pfVar4 = tcu::Vector<float,_4>::operator[]
                               ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                                forwardComponent.m_hi._0_4_);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pfVar4);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(char (*) [32])"\t\tdifference to a valid range: ");
            pfVar4 = tcu::Vector<float,_4>::operator[]
                               ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                                forwardComponent.m_hi._0_4_);
            fVar6 = *pfVar4;
            dVar7 = tcu::Interval::lo((Interval *)local_260);
            if (dVar7 <= (double)fVar6) {
              local_830 = (char (*) [2])0x137a60f;
            }
            else {
              local_830 = (char (*) [2])0x13c67c6;
            }
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_830);
            pfVar4 = tcu::Vector<float,_4>::operator[]
                               ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                                forwardComponent.m_hi._0_4_);
            fVar6 = *pfVar4;
            dVar7 = tcu::Interval::lo((Interval *)local_260);
            if (dVar7 <= (double)fVar6) {
              pfVar4 = tcu::Vector<float,_4>::operator[]
                                 ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                                  forwardComponent.m_hi._0_4_);
              fVar6 = *pfVar4;
              local_858 = tcu::Interval::hi((Interval *)local_260);
              local_858 = (double)fVar6 - local_858;
            }
            else {
              local_858 = tcu::Interval::lo((Interval *)local_260);
              pfVar4 = tcu::Vector<float,_4>::operator[]
                                 ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                                  forwardComponent.m_hi._0_4_);
              local_858 = local_858 - (double)*pfVar4;
            }
            local_438 = local_858;
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_438);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(char (*) [26])"\tDerivative value range:\n");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"\t\tMin: ");
            local_440 = tcu::Interval::lo((Interval *)local_260);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_440);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"\t\tMax: ");
            local_448 = tcu::Interval::hi((Interval *)local_260);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_448);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(local_42c + 0x1c));
          }
          x = x + 1;
          forwardComponent.m_hi._7_1_ = 1;
        }
        else {
          pfVar4 = tcu::Vector<float,_4>::operator[]
                             ((Vector<float,_4> *)(functionValueForward.m_data + 2),
                              forwardComponent.m_hi._0_4_);
          fVar6 = *pfVar4;
          dVar7 = tcu::Interval::hi((Interval *)local_260);
          if (dVar7 < (double)fVar6) goto LAB_00a9dab0;
        }
      }
      if ((forwardComponent.m_hi._7_1_ & 1) != 0) {
        tcu::PixelBufferAccess::setPixel
                  (errorMask,(IVec4 *)(green.m_data + 2),(int)resultDerivative.m_data[2],
                   (int)resultDerivative.m_data[3],0);
      }
    }
    resultDerivative.m_data[3] = (float)((int)resultDerivative.m_data[3] + 1);
  } while( true );
}

Assistant:

static bool reverifyConstantDerivateWithFlushRelaxations (tcu::TestLog&							log,
														  const tcu::ConstPixelBufferAccess&	result,
														  const tcu::PixelBufferAccess&			errorMask,
														  glu::DataType							dataType,
														  glu::Precision						precision,
														  const tcu::Vec4&						derivScale,
														  const tcu::Vec4&						derivBias,
														  const tcu::Vec4&						surfaceThreshold,
														  DerivateFunc							derivateFunc,
														  const Linear2DFunctionEvaluator&		function)
{
	DE_ASSERT(result.getWidth() == errorMask.getWidth());
	DE_ASSERT(result.getHeight() == errorMask.getHeight());
	DE_ASSERT(isDfdxFunc(derivateFunc) || isDfdyFunc(derivateFunc));

	const tcu::IVec4	red						(255, 0, 0, 255);
	const tcu::IVec4	green					(0, 255, 0, 255);
	const float			divisionErrorUlps		= 2.5f;

	const int			numComponents			= glu::getDataTypeFloatScalars(dataType);
	const int			numBits					= getNumMantissaBits(precision);
	const int			minExponent				= getMinExponent(precision);

	const int			numVaryingSampleBits	= numBits - INTERPOLATION_LOST_BITS;
	int					numFailedPixels			= 0;

	tcu::clear(errorMask, green);

	// search for failed pixels
	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		//                 flushToZero?(f2z?(functionValueCurrent) - f2z?(functionValueBefore))
		// flushToZero? ( ------------------------------------------------------------------------ +- 2.5 ULP )
		//                                                  dx

		const tcu::Vec4	resultDerivative		= readDerivate(result, derivScale, derivBias, x, y);

		// sample at the front of the back pixel and the back of the front pixel to cover the whole area of
		// legal sample positions. In general case this is NOT OK, but we know that the target funtion is
		// (mostly*) linear which allows us to take the sample points at arbitrary points. This gets us the
		// maximum difference possible in exponents which are used in error bound calculations.
		// * non-linearity may happen around zero or with very high function values due to subnorms not
		//   behaving well.
		const tcu::Vec4	functionValueForward	= (isDfdxFunc(derivateFunc))
													? (function.evaluateAt((float)x + 2.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y + 2.0f));
		const tcu::Vec4	functionValueBackward	= (isDfdyFunc(derivateFunc))
													? (function.evaluateAt((float)x - 1.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y - 1.0f));

		bool	anyComponentFailed				= false;

		// check components separately
		for (int c = 0; c < numComponents; ++c)
		{
			// Simulate interpolation. Add allowed interpolation error and round to target precision. Allow one half ULP (i.e. correct rounding)
			const tcu::Interval	forwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueForward[c],  -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueForward[c],  +0.5f, numVaryingSampleBits), minExponent, numBits));
			const tcu::Interval	backwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueBackward[c], -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueBackward[c], +0.5f, numVaryingSampleBits), minExponent, numBits));
			const int			maxValueExp				= de::max(de::max(tcu::Float32(forwardComponent.lo()).exponent(),   tcu::Float32(forwardComponent.hi()).exponent()),
																  de::max(tcu::Float32(backwardComponent.lo()).exponent(),  tcu::Float32(backwardComponent.hi()).exponent()));

			// subtraction in numerator will likely cause a cancellation of the most
			// significant bits. Apply error bounds.

			const tcu::Interval	numerator				(forwardComponent - backwardComponent);
			const int			numeratorLoExp			= tcu::Float32(numerator.lo()).exponent();
			const int			numeratorHiExp			= tcu::Float32(numerator.hi()).exponent();
			const int			numeratorLoBitsLost		= de::max(0, maxValueExp - numeratorLoExp); //!< must clamp to zero since if forward and backward components have different
			const int			numeratorHiBitsLost		= de::max(0, maxValueExp - numeratorHiExp); //!< sign, numerator might have larger exponent than its operands.
			const int			numeratorLoBits			= de::max(0, numBits - numeratorLoBitsLost);
			const int			numeratorHiBits			= de::max(0, numBits - numeratorHiBitsLost);

			const tcu::Interval	numeratorRange			(convertFloatFlushToZeroRtn((float)numerator.lo(), minExponent, numeratorLoBits),
														 convertFloatFlushToZeroRtp((float)numerator.hi(), minExponent, numeratorHiBits));

			const tcu::Interval	divisionRange			= numeratorRange / 3.0f; // legal sample area is anywhere within this and neighboring pixels (i.e. size = 3)
			const tcu::Interval	divisionResultRange		(convertFloatFlushToZeroRtn(addErrorUlp((float)divisionRange.lo(), -divisionErrorUlps, numBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)divisionRange.hi(), +divisionErrorUlps, numBits), minExponent, numBits));
			const tcu::Interval	finalResultRange		(divisionResultRange.lo() - surfaceThreshold[c], divisionResultRange.hi() + surfaceThreshold[c]);

			if (resultDerivative[c] >= finalResultRange.lo() && resultDerivative[c] <= finalResultRange.hi())
			{
				// value ok
			}
			else
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES)
					log << tcu::TestLog::Message
						<< "Error in pixel at " << x << ", " << y << " with component " << c << " (channel " << ("rgba"[c]) << ")\n"
						<< "\tGot pixel value " << result.getPixelInt(x, y) << "\n"
						<< "\t\tdFd" << ((isDfdxFunc(derivateFunc)) ? ('x') : ('y')) << " ~= " << resultDerivative[c] << "\n"
						<< "\t\tdifference to a valid range: "
							<< ((resultDerivative[c] < finalResultRange.lo()) ? ("-") : ("+"))
							<< ((resultDerivative[c] < finalResultRange.lo()) ? (finalResultRange.lo() - resultDerivative[c]) : (resultDerivative[c] - finalResultRange.hi()))
							<< "\n"
						<< "\tDerivative value range:\n"
						<< "\t\tMin: " << finalResultRange.lo() << "\n"
						<< "\t\tMax: " << finalResultRange.hi() << "\n"
						<< tcu::TestLog::EndMessage;

				++numFailedPixels;
				anyComponentFailed = true;
			}
		}

		if (anyComponentFailed)
			errorMask.setPixel(red, x, y);
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}